

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O2

off_t hseek(hFILE *fp,off_t offset,int whence)

{
  ssize_t sVar1;
  off_t oVar2;
  int *piVar3;
  
  if (fp->end < fp->begin) {
    sVar1 = flush_buffer(fp);
    if ((int)sVar1 < 0) {
      return (long)(int)sVar1;
    }
  }
  else if (whence == 1) {
    offset = (off_t)(fp->begin + (offset - (long)fp->end));
  }
  oVar2 = (*fp->backend->seek)(fp,offset,whence);
  if (oVar2 < 0) {
    piVar3 = __errno_location();
    fp->has_errno = *piVar3;
  }
  else {
    fp->end = fp->buffer;
    fp->begin = fp->buffer;
    fp->field_0x30 = fp->field_0x30 & 0xfe;
    fp->offset = oVar2;
  }
  return oVar2;
}

Assistant:

off_t hseek(hFILE *fp, off_t offset, int whence)
{
    off_t pos;

    if (writebuffer_is_nonempty(fp)) {
        int ret = flush_buffer(fp);
        if (ret < 0) return ret;
    }
    else {
        // Convert relative offsets from being relative to the hFILE's stream
        // position (at begin) to being relative to the backend's physical
        // stream position (at end, due to the buffering read-ahead).
        if (whence == SEEK_CUR) offset -= fp->end - fp->begin;
    }

    pos = fp->backend->seek(fp, offset, whence);
    if (pos < 0) { fp->has_errno = errno; return pos; }

    // Seeking succeeded, so discard any non-empty read buffer
    fp->begin = fp->end = fp->buffer;
    fp->at_eof = 0;

    fp->offset = pos;
    return pos;
}